

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O2

void sbox_s128_full(mzd_local_t *in,mzd_local_t *mask_a,mzd_local_t *mask_b,mzd_local_t *mask_c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar2 = *(undefined1 (*) [16])in->w64;
  auVar1 = *(undefined1 (*) [16])(in->w64 + 2);
  auVar7 = vandpd_avx(auVar2,*(undefined1 (*) [16])mask_a->w64);
  auVar4 = vandpd_avx(auVar1,*(undefined1 (*) [16])(mask_a->w64 + 2));
  auVar9 = vandpd_avx(auVar2,*(undefined1 (*) [16])mask_b->w64);
  auVar5 = vandpd_avx(auVar1,*(undefined1 (*) [16])(mask_b->w64 + 2));
  auVar2 = vandpd_avx(auVar2,*(undefined1 (*) [16])mask_c->w64);
  auVar1 = vandpd_avx(auVar1,*(undefined1 (*) [16])(mask_c->w64 + 2));
  auVar6 = vpslldq_avx(auVar7,8);
  auVar3 = vpsrldq_avx(auVar7,8);
  auVar6 = vpshldq_avx512_vbmi2(auVar7,auVar6,2);
  auVar7 = vpslldq_avx(auVar4,8);
  auVar3 = vpsrlq_avx(auVar3,0x3e);
  auVar7 = vpshldq_avx512_vbmi2(auVar4,auVar7,2);
  auVar8 = vpslldq_avx(auVar9,8);
  auVar7 = vpor_avx(auVar7,auVar3);
  auVar4 = vpsrldq_avx(auVar9,8);
  auVar3 = vpshldq_avx512_vbmi2(auVar9,auVar8,1);
  auVar9 = vpslldq_avx(auVar5,8);
  auVar9 = vpshldq_avx512_vbmi2(auVar5,auVar9,1);
  auVar5 = vpsrlq_avx(auVar4,0x3f);
  auVar4 = vpor_avx(auVar3,auVar6);
  auVar9 = vpor_avx(auVar9,auVar5);
  auVar5 = vpternlogq_avx512vl(auVar3,auVar2,auVar6,0xd2);
  auVar6 = vpternlogq_avx512vl(auVar6,auVar3,auVar2,0x78);
  auVar3 = vpternlogq_avx512vl(auVar9,auVar1,auVar7,0xd2);
  auVar10 = vpsrldq_avx(auVar6,8);
  auVar8 = vpsrldq_avx(auVar3,8);
  auVar6 = vpshldq_avx512_vbmi2(auVar10,auVar6,0x3e);
  auVar8 = vpshldq_avx512_vbmi2(auVar8,auVar3,0x3f);
  auVar3 = vpslldq_avx(auVar3,8);
  auVar10 = vpsllq_avx(auVar3,0x3f);
  auVar3 = vpternlogq_avx512vl(auVar8,auVar9,auVar7,0x1e);
  auVar9 = vpternlogq_avx512vl(auVar7,auVar9,auVar1,0x78);
  auVar7 = vpslldq_avx(auVar9,8);
  auVar7 = vpsllq_avx(auVar7,0x3e);
  auVar7 = vpor_avx(auVar7,auVar6);
  auVar6 = vpsrldq_avx(auVar9,8);
  auVar9 = vpshldq_avx512_vbmi2(auVar6,auVar9,0x3e);
  auVar6 = vpsrldq_avx(auVar5,8);
  auVar5 = vpshldq_avx512_vbmi2(auVar6,auVar5,0x3f);
  auVar1 = vpternlogq_avx512vl(auVar3,auVar1,auVar9,0x96);
  auVar4 = vpternlogq_avx512vl(auVar5,auVar4,auVar10,0x36);
  auVar2 = vpternlogq_avx512vl(auVar4,auVar2,auVar7,0x96);
  *(undefined1 (*) [16])in->w64 = auVar2;
  *(undefined1 (*) [16])(in->w64 + 2) = auVar1;
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void sbox_s128_full(mzd_local_t* in, const mzd_local_t* mask_a,
                                  const mzd_local_t* mask_b, const mzd_local_t* mask_c) {
  word128 inm[2] = {mm128_load(&in->w64[0]), mm128_load(&in->w64[2])};
  word128 x0m[2] = {mm128_load(&mask_a->w64[0]), mm128_load(&mask_a->w64[2])};
  word128 x1m[2] = {mm128_load(&mask_b->w64[0]), mm128_load(&mask_b->w64[2])};
  word128 x2m[2] = {mm128_load(&mask_c->w64[0]), mm128_load(&mask_c->w64[2])};
  mm128_and_256(x0m, inm, x0m);
  mm128_and_256(x1m, inm, x1m);
  mm128_and_256(x2m, inm, x2m);

  mm128_shift_left_256(x0m, x0m, 2);
  mm128_shift_left_256(x1m, x1m, 1);

  word128 t0[2], t1[2], t2[2];
  mm128_and_256(t0, x1m, x2m);
  mm128_and_256(t1, x0m, x2m);
  mm128_and_256(t2, x0m, x1m);

  mm128_xor_256(t0, t0, x0m);

  mm128_xor_256(x0m, x0m, x1m);
  mm128_xor_256(t1, t1, x0m);

  mm128_xor_256(t2, t2, x0m);
  mm128_xor_256(t2, t2, x2m);

  mm128_shift_right_256(t0, t0, 2);
  mm128_shift_right_256(t1, t1, 1);

  mm128_xor_256(t0, t0, t1);
  mm128_xor_256(inm, t0, t2);
  mm128_store(&in->w64[0], inm[0]);
  mm128_store(&in->w64[2], inm[1]);
}